

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<ki::dml::Field<short>_> * __thiscall
pybind11::class_<ki::dml::Field<short>>::
def_property_readonly<bool(ki::dml::FieldBase::*)()const,pybind11::return_value_policy>
          (class_<ki::dml::Field<short>> *this,char *name,offset_in_FieldBase_to_subr *fget,
          return_value_policy *extra)

{
  class_<ki::dml::Field<short>_> *pcVar1;
  return_value_policy local_31;
  cpp_function local_30;
  void *local_28;
  
  cpp_function::cpp_function<bool,ki::dml::Field<short>>(&local_30,*fget);
  local_31 = reference_internal;
  local_28 = (void *)0x0;
  pcVar1 = def_property<pybind11::cpp_function,decltype(nullptr),pybind11::return_value_policy,pybind11::return_value_policy>
                     (this,name,&local_30,&local_28,&local_31,extra);
  object::~object((object *)&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }